

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrWorldMeshBlockML *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  XrStructureType XVar2;
  XrWorldMeshBlockResultML XVar3;
  XrWorldMeshDetectorLodML XVar4;
  pointer pcVar5;
  PFN_xrStructureTypeToString p_Var6;
  void *value_00;
  XrStructureType __val;
  XrWorldMeshBlockResultML __val_00;
  XrWorldMeshDetectorLodML __val_01;
  uint uVar7;
  char cVar8;
  bool bVar9;
  char *pcVar10;
  XrInstance pXVar11;
  invalid_argument *piVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  char cVar18;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  string uuid_prefix;
  string next_prefix;
  string type_prefix;
  string vertexcount_prefix;
  string indexbuffer_prefix;
  string indexcount_prefix;
  string flags_prefix;
  string lod_prefix;
  string blockresult_prefix;
  string confidencebuffer_prefix;
  string confidencecount_prefix;
  string normalbuffer_prefix;
  string normalcount_prefix;
  string vertexbuffer_prefix;
  ostringstream oss_indexCount;
  ostringstream oss_indexBuffer;
  ostringstream oss_confidenceCount;
  ostringstream oss_normalCount;
  ostringstream oss_vertexCount;
  ostringstream oss_normalBuffer;
  ostringstream oss_vertexBuffer;
  ostringstream oss_confidenceBuffer;
  long *local_e38;
  long local_e30;
  long local_e28 [2];
  long *local_e18;
  long local_e10;
  long local_e08 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  undefined1 local_c78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c68;
  string local_c58;
  string local_c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8;
  PFN_xrEnumerateViewConfigurations local_bd8;
  PFN_xrGetViewConfigurationProperties p_Stack_bd0;
  PFN_xrEnumerateViewConfigurationViews local_bc8;
  PFN_xrEnumerateSwapchainFormats p_Stack_bc0;
  ios_base local_b88 [272];
  undefined1 local_a78 [24];
  uint auStack_a60 [22];
  ios_base local_a08 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900 [3];
  ios_base local_890 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788 [3];
  ios_base local_718 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610 [3];
  ios_base local_5a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
  local_a78._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_bf8,'\x12');
  *local_bf8._M_dataplus._M_p = '0';
  local_bf8._M_dataplus._M_p[1] = 'x';
  pcVar10 = local_bf8._M_dataplus._M_p + local_bf8._M_string_length + -1;
  lVar14 = 0;
  do {
    bVar1 = local_a78[lVar14];
    *pcVar10 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar10[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar14 = lVar14 + 1;
    pcVar10 = pcVar10 + -2;
  } while (lVar14 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
    operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_df8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_df8);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar2 = value->type;
    __val = -XVar2;
    if (0 < (int)XVar2) {
      __val = XVar2;
    }
    uVar17 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar16 = (ulong)__val;
      uVar7 = 4;
      do {
        uVar17 = uVar7;
        uVar13 = (uint)uVar16;
        if (uVar13 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0020f0e7;
        }
        if (uVar13 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0020f0e7;
        }
        if (uVar13 < 10000) goto LAB_0020f0e7;
        uVar16 = uVar16 / 10000;
        uVar7 = uVar17 + 4;
      } while (99999 < uVar13);
      uVar17 = uVar17 + 1;
    }
LAB_0020f0e7:
    local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_bf8,(char)uVar17 - (char)((int)XVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_bf8._M_dataplus._M_p + (XVar2 >> 0x1f),uVar17,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_df8,&local_bf8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
      operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_bc8 = (PFN_xrEnumerateViewConfigurationViews)0x0;
    p_Stack_bc0 = (PFN_xrEnumerateSwapchainFormats)0x0;
    local_bd8 = (PFN_xrEnumerateViewConfigurations)0x0;
    p_Stack_bd0 = (PFN_xrGetViewConfigurationProperties)0x0;
    local_bf8.field_2._M_allocated_capacity = 0;
    local_bf8.field_2._8_8_ = 0;
    local_bf8._M_dataplus._M_p = (pointer)0x0;
    local_bf8._M_string_length = 0;
    p_Var6 = gen_dispatch_table->StructureTypeToString;
    pXVar11 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var6)(pXVar11,value->type,(char *)&local_bf8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_df8,(char (*) [64])&local_bf8);
  }
  local_e18 = local_e08;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e18,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e18);
  value_00 = value->next;
  local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c38,local_e18,local_e10 + (long)local_e18);
  bVar9 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_c38,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
    operator_delete(local_c38._M_dataplus._M_p,local_c38.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar12,"Invalid Operation");
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_e38 = local_e28;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e38,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_e38);
  local_c58._M_dataplus._M_p = (pointer)&local_c58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c58,local_e38,local_e30 + (long)local_e38);
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_c78;
  local_c78._0_8_ = local_c78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)gen_dispatch_table_00,"XrUuidEXT","");
  bVar9 = ApiDumpOutputXrStruct
                    (gen_dispatch_table_00,&value->uuid,&local_c58,(string *)local_c78,false,
                     contents);
  if ((undefined1 *)local_c78._0_8_ != local_c78 + 0x10) {
    operator_delete((void *)local_c78._0_8_,(ulong)(local_c68._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
    operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar12,"Invalid Operation");
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d38,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_d38);
  XVar3 = value->blockResult;
  __val_00 = -XVar3;
  if (0 < (int)XVar3) {
    __val_00 = XVar3;
  }
  uVar17 = 1;
  if (9 < __val_00) {
    uVar16 = (ulong)__val_00;
    uVar7 = 4;
    do {
      uVar17 = uVar7;
      uVar13 = (uint)uVar16;
      if (uVar13 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_0020f376;
      }
      if (uVar13 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_0020f376;
      }
      if (uVar13 < 10000) goto LAB_0020f376;
      uVar16 = uVar16 / 10000;
      uVar7 = uVar17 + 4;
    } while (99999 < uVar13);
    uVar17 = uVar17 + 1;
  }
LAB_0020f376:
  local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_bf8,(char)uVar17 - (char)((int)XVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_bf8._M_dataplus._M_p + (XVar3 >> 0x1f),uVar17,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[25],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [25])"XrWorldMeshBlockResultML",&local_d38,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
    operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
  }
  local_d58._M_dataplus._M_p = (pointer)&local_d58.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d58,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_d58);
  XVar4 = value->lod;
  __val_01 = -XVar4;
  if (0 < (int)XVar4) {
    __val_01 = XVar4;
  }
  uVar17 = 1;
  if (9 < __val_01) {
    uVar16 = (ulong)__val_01;
    uVar7 = 4;
    do {
      uVar17 = uVar7;
      uVar13 = (uint)uVar16;
      if (uVar13 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_0020f489;
      }
      if (uVar13 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_0020f489;
      }
      if (uVar13 < 10000) goto LAB_0020f489;
      uVar16 = uVar16 / 10000;
      uVar7 = uVar17 + 4;
    } while (99999 < uVar13);
    uVar17 = uVar17 + 1;
  }
LAB_0020f489:
  local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_bf8,(char)uVar17 - (char)((int)XVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_bf8._M_dataplus._M_p + (XVar4 >> 0x1f),uVar17,__val_01);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[25],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [25])"XrWorldMeshDetectorLodML",&local_d58,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
    operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
  }
  local_d78._M_dataplus._M_p = (pointer)&local_d78.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d78,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_d78);
  uVar16 = value->flags;
  cVar18 = '\x01';
  if (9 < uVar16) {
    uVar15 = uVar16;
    cVar8 = '\x04';
    do {
      cVar18 = cVar8;
      if (uVar15 < 100) {
        cVar18 = cVar18 + -2;
        goto LAB_0020f5a2;
      }
      if (uVar15 < 1000) {
        cVar18 = cVar18 + -1;
        goto LAB_0020f5a2;
      }
      if (uVar15 < 10000) goto LAB_0020f5a2;
      bVar9 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar8 = cVar18 + '\x04';
    } while (bVar9);
    cVar18 = cVar18 + '\x01';
  }
LAB_0020f5a2:
  local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_bf8,cVar18);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_bf8._M_dataplus._M_p,(uint)local_bf8._M_string_length,uVar16);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[27],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [27])"XrWorldMeshDetectorFlagsML",&local_d78,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
    operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
  }
  local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d98,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_d98);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_bf8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_bf8,"0x",2);
  *(uint *)((long)&local_bf8.field_2 + *(long *)(local_bf8._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_bf8.field_2 + *(long *)(local_bf8._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_bf8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_d98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a78);
  if ((XrWorldMeshBlockML *)local_a78._0_8_ != (XrWorldMeshBlockML *)(local_a78 + 0x10)) {
    operator_delete((void *)local_a78._0_8_,(ulong)(local_a78._16_8_ + 1));
  }
  local_db8._M_dataplus._M_p = (pointer)&local_db8.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_db8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_db8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a78);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a78,"0x",2);
  *(uint *)((long)auStack_a60 + (long)*(XrVector3f **)(local_a78._0_8_ + -0x18)) =
       *(uint *)((long)auStack_a60 + (long)*(XrVector3f **)(local_a78._0_8_ + -0x18)) & 0xffffffb5 |
       8;
  std::ostream::_M_insert<void_const*>(local_a78);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[10],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [10])"uint16_t*",&local_db8,local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610[0]._M_dataplus._M_p != &local_610[0].field_2) {
    operator_delete(local_610[0]._M_dataplus._M_p,
                    (ulong)(local_610[0].field_2._M_allocated_capacity + 1));
  }
  local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_dd8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_dd8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"0x",2);
  *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_610);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_dd8,local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,
                    (ulong)(local_320[0].field_2._M_allocated_capacity + 1));
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_c98._M_dataplus._M_p = (pointer)&local_c98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c98,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_c98);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_320);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [12])0x2a22d0,&local_c98,local_788);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788[0]._M_dataplus._M_p != &local_788[0].field_2) {
    operator_delete(local_788[0]._M_dataplus._M_p,
                    (ulong)(local_788[0].field_2._M_allocated_capacity + 1));
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cb8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_cb8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_788,"0x",2);
  *(uint *)((long)&local_788[0].field_2 + *(long *)(local_788[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_788[0].field_2 + *(long *)(local_788[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_788);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_cb8,local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,
                    (ulong)(local_498[0].field_2._M_allocated_capacity + 1));
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cd8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_cd8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_498);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [12])0x2a22d0,&local_cd8,local_900);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900[0]._M_dataplus._M_p != &local_900[0].field_2) {
    operator_delete(local_900[0]._M_dataplus._M_p,
                    (ulong)(local_900[0].field_2._M_allocated_capacity + 1));
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cf8,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_cf8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_900);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_900,"0x",2);
  *(uint *)((long)&local_900[0].field_2 + *(long *)(local_900[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_900[0].field_2 + *(long *)(local_900[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_900);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_cf8,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  pcVar5 = (prefix->_M_dataplus)._M_p;
  local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d18,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_d18);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(undefined8 *)
   ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) = 0x20;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])0x2a2c8c,&local_d18,&local_c18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
    operator_delete(local_c18._M_dataplus._M_p,(ulong)(local_c18.field_2._M_allocated_capacity + 1))
    ;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    operator_delete(local_d18._M_dataplus._M_p,local_d18.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_900);
  std::ios_base::~ios_base(local_890);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    operator_delete(local_cf8._M_dataplus._M_p,local_cf8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
  std::ios_base::~ios_base(local_718);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
    operator_delete(local_cb8._M_dataplus._M_p,local_cb8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c98._M_dataplus._M_p != &local_c98.field_2) {
    operator_delete(local_c98._M_dataplus._M_p,local_c98.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
  std::ios_base::~ios_base(local_5a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
    operator_delete(local_dd8._M_dataplus._M_p,local_dd8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a78);
  std::ios_base::~ios_base(local_a08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db8._M_dataplus._M_p != &local_db8.field_2) {
    operator_delete(local_db8._M_dataplus._M_p,local_db8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_bf8);
  std::ios_base::~ios_base(local_b88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
    operator_delete(local_d98._M_dataplus._M_p,local_d98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78._M_dataplus._M_p != &local_d78.field_2) {
    operator_delete(local_d78._M_dataplus._M_p,local_d78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d58._M_dataplus._M_p != &local_d58.field_2) {
    operator_delete(local_d58._M_dataplus._M_p,local_d58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p,local_d38.field_2._M_allocated_capacity + 1);
  }
  if (local_e38 != local_e28) {
    operator_delete(local_e38,local_e28[0] + 1);
  }
  if (local_e18 != local_e08) {
    operator_delete(local_e18,local_e08[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
    operator_delete(local_df8._M_dataplus._M_p,local_df8.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrWorldMeshBlockML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string uuid_prefix = prefix;
        uuid_prefix += "uuid";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->uuid, uuid_prefix, "XrUuidEXT", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string blockresult_prefix = prefix;
        blockresult_prefix += "blockResult";
        contents.emplace_back("XrWorldMeshBlockResultML", blockresult_prefix, std::to_string(value->blockResult));
        std::string lod_prefix = prefix;
        lod_prefix += "lod";
        contents.emplace_back("XrWorldMeshDetectorLodML", lod_prefix, std::to_string(value->lod));
        std::string flags_prefix = prefix;
        flags_prefix += "flags";
        contents.emplace_back("XrWorldMeshDetectorFlagsML", flags_prefix, std::to_string(value->flags));
        std::string indexcount_prefix = prefix;
        indexcount_prefix += "indexCount";
        std::ostringstream oss_indexCount;
        oss_indexCount << "0x" << std::hex << (value->indexCount);
        contents.emplace_back("uint32_t", indexcount_prefix, oss_indexCount.str());
        std::string indexbuffer_prefix = prefix;
        indexbuffer_prefix += "indexBuffer";
        std::ostringstream oss_indexBuffer;
        oss_indexBuffer << "0x" << std::hex << (value->indexBuffer);
        contents.emplace_back("uint16_t*", indexbuffer_prefix, oss_indexBuffer.str());
        std::string vertexcount_prefix = prefix;
        vertexcount_prefix += "vertexCount";
        std::ostringstream oss_vertexCount;
        oss_vertexCount << "0x" << std::hex << (value->vertexCount);
        contents.emplace_back("uint32_t", vertexcount_prefix, oss_vertexCount.str());
        std::string vertexbuffer_prefix = prefix;
        vertexbuffer_prefix += "vertexBuffer";
        std::ostringstream oss_vertexBuffer;
        oss_vertexBuffer << std::hex << reinterpret_cast<const void*>(value->vertexBuffer);
        contents.emplace_back("XrVector3f*", vertexbuffer_prefix, oss_vertexBuffer.str());
        std::string normalcount_prefix = prefix;
        normalcount_prefix += "normalCount";
        std::ostringstream oss_normalCount;
        oss_normalCount << "0x" << std::hex << (value->normalCount);
        contents.emplace_back("uint32_t", normalcount_prefix, oss_normalCount.str());
        std::string normalbuffer_prefix = prefix;
        normalbuffer_prefix += "normalBuffer";
        std::ostringstream oss_normalBuffer;
        oss_normalBuffer << std::hex << reinterpret_cast<const void*>(value->normalBuffer);
        contents.emplace_back("XrVector3f*", normalbuffer_prefix, oss_normalBuffer.str());
        std::string confidencecount_prefix = prefix;
        confidencecount_prefix += "confidenceCount";
        std::ostringstream oss_confidenceCount;
        oss_confidenceCount << "0x" << std::hex << (value->confidenceCount);
        contents.emplace_back("uint32_t", confidencecount_prefix, oss_confidenceCount.str());
        std::string confidencebuffer_prefix = prefix;
        confidencebuffer_prefix += "confidenceBuffer";
        std::ostringstream oss_confidenceBuffer;
        oss_confidenceBuffer << std::setprecision(32) << (value->confidenceBuffer);
        contents.emplace_back("float*", confidencebuffer_prefix, oss_confidenceBuffer.str());
        return true;
    } catch(...) {
    }
    return false;
}